

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

_Bool ra_overwrite(roaring_array_t *source,roaring_array_t *dest,_Bool copy_on_write)

{
  _Bool _Var1;
  container_t *pcVar2;
  int32_t new_capacity;
  int32_t j;
  long lVar3;
  int32_t i;
  long lVar4;
  
  ra_clear_containers(dest);
  new_capacity = source->size;
  if (new_capacity == 0) {
    dest->size = 0;
  }
  else {
    if (dest->allocation_size < new_capacity) {
      _Var1 = realloc_array(dest,new_capacity);
      if (!_Var1) {
        return false;
      }
      new_capacity = source->size;
    }
    dest->size = new_capacity;
    memcpy(dest->keys,source->keys,(long)new_capacity * 2);
    if (copy_on_write) {
      for (lVar4 = 0; lVar4 < dest->size; lVar4 = lVar4 + 1) {
        pcVar2 = get_copy_of_container(source->containers[lVar4],source->typecodes + lVar4,true);
        source->containers[lVar4] = pcVar2;
      }
      memcpy(dest->containers,source->containers,(long)dest->size << 3);
      memcpy(dest->typecodes,source->typecodes,(long)dest->size);
    }
    else {
      memcpy(dest->typecodes,source->typecodes,(long)dest->size);
      for (lVar4 = 0; lVar4 < dest->size; lVar4 = lVar4 + 1) {
        pcVar2 = container_clone(source->containers[lVar4],source->typecodes[lVar4]);
        dest->containers[lVar4] = pcVar2;
        if (dest->containers[lVar4] == (void *)0x0) {
          for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 1) {
            container_free(dest->containers[lVar3],dest->typecodes[lVar3]);
          }
          ra_clear_without_containers(dest);
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool ra_overwrite(const roaring_array_t *source, roaring_array_t *dest,
                  bool copy_on_write) {
    ra_clear_containers(dest);  // we are going to overwrite them
    if (source->size == 0) {    // Note: can't call memcpy(NULL), even w/size
        dest->size = 0;         // <--- This is important.
        return true;            // output was just cleared, so they match
    }
    if (dest->allocation_size < source->size) {
        if (!realloc_array(dest, source->size)) {
            return false;
        }
    }
    dest->size = source->size;
    memcpy(dest->keys, source->keys, dest->size * sizeof(uint16_t));
    // we go through the containers, turning them into shared containers...
    if (copy_on_write) {
        for (int32_t i = 0; i < dest->size; ++i) {
            source->containers[i] = get_copy_of_container(
                source->containers[i], &source->typecodes[i], copy_on_write);
        }
        // we do a shallow copy to the other bitmap
        memcpy(dest->containers, source->containers,
               dest->size * sizeof(container_t *));
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
    } else {
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
        for (int32_t i = 0; i < dest->size; i++) {
            dest->containers[i] =
                container_clone(source->containers[i], source->typecodes[i]);
            if (dest->containers[i] == NULL) {
                for (int32_t j = 0; j < i; j++) {
                    container_free(dest->containers[j], dest->typecodes[j]);
                }
                ra_clear_without_containers(dest);
                return false;
            }
        }
    }
    return true;
}